

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaCheckSRCRedefineSecond(xmlSchemaParserCtxtPtr pctxt)

{
  xmlSchemaRedefPtr_conflict pxVar1;
  xmlSchemaBasicItemPtr item_00;
  int iVar2;
  xmlSchemaBasicItemPtr item;
  xmlSchemaRedefPtr_conflict redef;
  int err;
  xmlSchemaParserCtxtPtr pctxt_local;
  
  pxVar1 = pctxt->constructor->redefs;
  do {
    while( true ) {
      if (pxVar1 == (xmlSchemaRedefPtr_conflict)0x0) {
        return 0;
      }
      if (pxVar1->target != (xmlSchemaBasicItemPtr)0x0) break;
      pxVar1 = pxVar1->next;
    }
    item_00 = pxVar1->item;
    if (item_00->type - XML_SCHEMA_TYPE_SIMPLE < 2) {
      *(undefined8 *)(pxVar1->target + 1) = 0;
    }
    else if ((item_00->type == XML_SCHEMA_TYPE_ATTRIBUTEGROUP) &&
            (iVar2 = xmlSchemaCheckDerivationOKRestriction2to4
                               (pctxt,1,item_00,pxVar1->target,
                                *(xmlSchemaItemListPtr *)(item_00 + 7),
                                *(xmlSchemaItemListPtr *)(pxVar1->target + 7),
                                *(xmlSchemaWildcardPtr *)(item_00 + 5),
                                *(xmlSchemaWildcardPtr *)(pxVar1->target + 5)), iVar2 == -1)) {
      return -1;
    }
    pxVar1 = pxVar1->next;
  } while( true );
}

Assistant:

static int
xmlSchemaCheckSRCRedefineSecond(xmlSchemaParserCtxtPtr pctxt)
{
    int err = 0;
    xmlSchemaRedefPtr redef = WXS_CONSTRUCTOR(pctxt)->redefs;
    xmlSchemaBasicItemPtr item;

    if (redef == NULL)
	return(0);

    do {
	if (redef->target == NULL) {
	    redef = redef->next;
	    continue;
	}
	item = redef->item;

	switch (item->type) {
	    case XML_SCHEMA_TYPE_SIMPLE:
	    case XML_SCHEMA_TYPE_COMPLEX:
		/*
		* Since the spec wants the {name} of the redefined
		* type to be 'absent', we'll NULL it.
		*/
		(WXS_TYPE_CAST redef->target)->name = NULL;

		/*
		* TODO: Seems like there's nothing more to do. The normal
		* inheritance mechanism is used. But not 100% sure.
		*/
		break;
	    case XML_SCHEMA_TYPE_GROUP:
		/*
		* URGENT TODO:
		* SPEC src-redefine:
		* (6.2.2) "The {model group} of the model group definition
		* which corresponds to it per XML Representation of Model
		* Group Definition Schema Components ($3.7.2) must be a
		* `valid restriction` of the {model group} of that model
		* group definition in I, as defined in Particle Valid
		* (Restriction) ($3.9.6)."
		*/
		break;
	    case XML_SCHEMA_TYPE_ATTRIBUTEGROUP:
		/*
		* SPEC src-redefine:
		* (7.2.2) "The {attribute uses} and {attribute wildcard} of
		* the attribute group definition which corresponds to it
		* per XML Representation of Attribute Group Definition Schema
		* Components ($3.6.2) must be `valid restrictions` of the
		* {attribute uses} and {attribute wildcard} of that attribute
		* group definition in I, as defined in clause 2, clause 3 and
		* clause 4 of Derivation Valid (Restriction, Complex)
		* ($3.4.6) (where references to the base type definition are
		* understood as references to the attribute group definition
		* in I)."
		*/
		err = xmlSchemaCheckDerivationOKRestriction2to4(pctxt,
		    XML_SCHEMA_ACTION_REDEFINE,
		    item, redef->target,
		    (WXS_ATTR_GROUP_CAST item)->attrUses,
		    (WXS_ATTR_GROUP_CAST redef->target)->attrUses,
		    (WXS_ATTR_GROUP_CAST item)->attributeWildcard,
		    (WXS_ATTR_GROUP_CAST redef->target)->attributeWildcard);
		if (err == -1)
		    return(-1);
		break;
	    default:
		break;
	}
	redef = redef->next;
    } while (redef != NULL);
    return(0);
}